

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

iterator_with_flag __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
::m_insert_unique<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
           *this,exception_ptr_error *err,int *v)

{
  int *k;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  pair<nestl::impl::detail::rb_tree_node_base_*,_nestl::impl::detail::rb_tree_node_base_*> pVar2;
  iterator_with_flag iVar3;
  bool local_61;
  rb_tree_iterator<int> local_60;
  bool local_51;
  rb_tree_iterator<int> local_50;
  iterator pos;
  link_type local_40;
  pair<nestl::impl::detail::rb_tree_node_base_*,_nestl::impl::detail::rb_tree_node_base_*> res;
  int *v_local;
  exception_ptr_error *err_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
  *this_local;
  bool local_10;
  
  k = identity<int>::operator()((identity<int> *)((long)&pos.m_node + 7),v);
  pVar2 = rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
          ::m_get_insert_unique_pos
                    ((rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::minimal_allocator<int>_>
                      *)this,k);
  res.first = pVar2.second;
  local_40 = (link_type)pVar2.first;
  if (res.first == (rb_tree_node_base *)0x0) {
    rb_tree_iterator<int>::rb_tree_iterator(&local_60,local_40);
    local_61 = false;
    std::pair<nestl::impl::detail::rb_tree_iterator<int>,_bool>::
    pair<nestl::impl::detail::rb_tree_iterator<int>,_bool,_true>
              ((pair<nestl::impl::detail::rb_tree_iterator<int>,_bool> *)&this_local,&local_60,
               &local_61);
    uVar1 = extraout_RDX_00;
  }
  else {
    local_50.m_node =
         (base_ptr)
         m_insert_<nestl::has_exceptions::exception_ptr_error,int>
                   (this,err,(base_ptr)local_40,res.first,v);
    local_51 = true;
    std::pair<nestl::impl::detail::rb_tree_iterator<int>,_bool>::
    pair<nestl::impl::detail::rb_tree_iterator<int>_&,_bool,_true>
              ((pair<nestl::impl::detail::rb_tree_iterator<int>,_bool> *)&this_local,&local_50,
               &local_51);
    uVar1 = extraout_RDX;
  }
  iVar3._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  iVar3.second = local_10;
  iVar3.first.m_node = (base_ptr)this_local;
  return iVar3;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator_with_flag
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_insert_unique(OperationError& err, Arg&& v) NESTL_NOEXCEPT_SPEC
{
    std::pair<base_ptr, base_ptr> res = m_get_insert_unique_pos(KeyOfValue()(v));

    if (res.second)
    {
        iterator pos = m_insert_(err, res.first, res.second, std::forward<Arg>(v));
        // NOTE: we return unconditionally, even in case of error
        return {pos, true};
    }

    return {iterator(static_cast<link_type>(res.first)), false};
}